

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_7_channels_with_8_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float *pfVar74;
  long lVar75;
  
  pfVar1 = output_buffer + output_sub_size * 7;
  pfVar74 = horizontal_coefficients + 4;
  do {
    lVar75 = (long)horizontal_contributors->n0;
    fVar10 = pfVar74[-4];
    fVar11 = pfVar74[-3];
    fVar12 = pfVar74[-2];
    fVar13 = pfVar74[-1];
    pfVar2 = decode_buffer + lVar75 * 7;
    fVar14 = *pfVar2;
    fVar15 = pfVar2[1];
    fVar16 = pfVar2[2];
    fVar17 = pfVar2[3];
    pfVar2 = decode_buffer + lVar75 * 7 + 3;
    fVar18 = pfVar2[1];
    fVar19 = pfVar2[2];
    fVar20 = pfVar2[3];
    pfVar3 = decode_buffer + lVar75 * 7 + 7;
    fVar21 = *pfVar3;
    fVar22 = pfVar3[1];
    fVar23 = pfVar3[2];
    fVar24 = pfVar3[3];
    pfVar3 = decode_buffer + lVar75 * 7 + 10;
    fVar25 = pfVar3[1];
    fVar26 = pfVar3[2];
    fVar27 = pfVar3[3];
    pfVar4 = decode_buffer + lVar75 * 7 + 0xe;
    fVar28 = *pfVar4;
    fVar29 = pfVar4[1];
    fVar30 = pfVar4[2];
    fVar31 = pfVar4[3];
    pfVar4 = decode_buffer + lVar75 * 7 + 0x11;
    fVar32 = pfVar4[1];
    fVar33 = pfVar4[2];
    fVar34 = pfVar4[3];
    pfVar5 = decode_buffer + lVar75 * 7 + 0x15;
    fVar35 = *pfVar5;
    fVar36 = pfVar5[1];
    fVar37 = pfVar5[2];
    fVar38 = pfVar5[3];
    pfVar5 = decode_buffer + lVar75 * 7 + 0x18;
    fVar39 = pfVar5[1];
    fVar40 = pfVar5[2];
    fVar41 = pfVar5[3];
    fVar42 = *pfVar74;
    fVar43 = pfVar74[1];
    fVar44 = pfVar74[2];
    fVar45 = pfVar74[3];
    pfVar6 = decode_buffer + lVar75 * 7 + 0x1c;
    fVar46 = *pfVar6;
    fVar47 = pfVar6[1];
    fVar48 = pfVar6[2];
    fVar49 = pfVar6[3];
    pfVar6 = decode_buffer + lVar75 * 7 + 0x1f;
    fVar50 = pfVar6[1];
    fVar51 = pfVar6[2];
    fVar52 = pfVar6[3];
    pfVar7 = decode_buffer + lVar75 * 7 + 0x23;
    fVar53 = *pfVar7;
    fVar54 = pfVar7[1];
    fVar55 = pfVar7[2];
    fVar56 = pfVar7[3];
    pfVar7 = decode_buffer + lVar75 * 7 + 0x26;
    fVar57 = pfVar7[1];
    fVar58 = pfVar7[2];
    fVar59 = pfVar7[3];
    pfVar8 = decode_buffer + lVar75 * 7 + 0x2a;
    fVar60 = *pfVar8;
    fVar61 = pfVar8[1];
    fVar62 = pfVar8[2];
    fVar63 = pfVar8[3];
    pfVar8 = decode_buffer + lVar75 * 7 + 0x2d;
    fVar64 = pfVar8[1];
    fVar65 = pfVar8[2];
    fVar66 = pfVar8[3];
    pfVar9 = decode_buffer + lVar75 * 7 + 0x31;
    fVar67 = *pfVar9;
    fVar68 = pfVar9[1];
    fVar69 = pfVar9[2];
    fVar70 = pfVar9[3];
    pfVar9 = decode_buffer + lVar75 * 7 + 0x34;
    fVar71 = pfVar9[1];
    fVar72 = pfVar9[2];
    fVar73 = pfVar9[3];
    output_buffer[3] =
         *pfVar9 * fVar45 + fVar43 * *pfVar7 + *pfVar5 * fVar13 + fVar11 * *pfVar3 +
         *pfVar8 * fVar44 + *pfVar6 * fVar42 + *pfVar4 * fVar12 + *pfVar2 * fVar10;
    output_buffer[4] =
         fVar71 * fVar45 + fVar43 * fVar57 + fVar39 * fVar13 + fVar11 * fVar25 +
         fVar64 * fVar44 + fVar50 * fVar42 + fVar32 * fVar12 + fVar18 * fVar10;
    output_buffer[5] =
         fVar72 * fVar45 + fVar43 * fVar58 + fVar40 * fVar13 + fVar11 * fVar26 +
         fVar65 * fVar44 + fVar51 * fVar42 + fVar33 * fVar12 + fVar19 * fVar10;
    output_buffer[6] =
         fVar73 * fVar45 + fVar43 * fVar59 + fVar41 * fVar13 + fVar11 * fVar27 +
         fVar66 * fVar44 + fVar52 * fVar42 + fVar34 * fVar12 + fVar20 * fVar10;
    *output_buffer =
         fVar67 * fVar45 + fVar53 * fVar43 + fVar35 * fVar13 + fVar21 * fVar11 +
         fVar60 * fVar44 + fVar46 * fVar42 + fVar28 * fVar12 + fVar14 * fVar10;
    output_buffer[1] =
         fVar68 * fVar45 + fVar54 * fVar43 + fVar36 * fVar13 + fVar22 * fVar11 +
         fVar61 * fVar44 + fVar47 * fVar42 + fVar29 * fVar12 + fVar15 * fVar10;
    output_buffer[2] =
         fVar69 * fVar45 + fVar55 * fVar43 + fVar37 * fVar13 + fVar23 * fVar11 +
         fVar62 * fVar44 + fVar48 * fVar42 + fVar30 * fVar12 + fVar16 * fVar10;
    output_buffer[3] =
         fVar70 * fVar45 + fVar56 * fVar43 + fVar38 * fVar13 + fVar24 * fVar11 +
         fVar63 * fVar44 + fVar49 * fVar42 + fVar31 * fVar12 + fVar17 * fVar10;
    horizontal_contributors = horizontal_contributors + 1;
    output_buffer = output_buffer + 7;
    pfVar74 = pfVar74 + coefficient_width;
  } while (output_buffer < pfVar1);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_8_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__store_output();
  } while ( output < output_end );
}